

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3FixInit(DbFixer *pFix,Parse *pParse,int iDb,char *zType,Token *pName)

{
  sqlite3 *psVar1;
  sqlite3 *db;
  Token *pName_local;
  char *zType_local;
  int iDb_local;
  Parse *pParse_local;
  DbFixer *pFix_local;
  
  if ((iDb < 0) || (iDb == 1)) {
    pFix_local._4_4_ = 0;
  }
  else {
    psVar1 = pParse->db;
    pFix->pParse = pParse;
    pFix->zDb = psVar1->aDb[iDb].zName;
    pFix->pSchema = psVar1->aDb[iDb].pSchema;
    pFix->zType = zType;
    pFix->pName = pName;
    pFix_local._4_4_ = 1;
  }
  return pFix_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3FixInit(
  DbFixer *pFix,      /* The fixer to be initialized */
  Parse *pParse,      /* Error messages will be written here */
  int iDb,            /* This is the database that must be used */
  const char *zType,  /* "view", "trigger", or "index" */
  const Token *pName  /* Name of the view, trigger, or index */
){
  sqlite3 *db;

  if( NEVER(iDb<0) || iDb==1 ) return 0;
  db = pParse->db;
  assert( db->nDb>iDb );
  pFix->pParse = pParse;
  pFix->zDb = db->aDb[iDb].zName;
  pFix->pSchema = db->aDb[iDb].pSchema;
  pFix->zType = zType;
  pFix->pName = pName;
  return 1;
}